

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void mg_set_websocket_handler_with_subprotocols
               (mg_context *ctx,char *uri,mg_websocket_subprotocols *subprotocols,
               mg_websocket_connect_handler connect_handler,mg_websocket_ready_handler ready_handler
               ,mg_websocket_data_handler data_handler,mg_websocket_close_handler close_handler,
               void *cbdata)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3._8_8_ = close_handler;
  auVar3._0_8_ = data_handler;
  auVar4._8_8_ = ready_handler;
  auVar4._0_8_ = connect_handler;
  auVar4 = auVar4 | auVar3;
  auVar2._0_4_ = -(uint)(auVar4._0_4_ == 0);
  auVar2._4_4_ = -(uint)(auVar4._4_4_ == 0);
  auVar2._8_4_ = -(uint)(auVar4._8_4_ == 0);
  auVar2._12_4_ = -(uint)(auVar4._12_4_ == 0);
  iVar1 = movmskps((int)uri,auVar2);
  mg_set_handler_type(ctx,&ctx->dd,uri,1,(uint)(iVar1 == 0xf),(mg_request_handler)0x0,subprotocols,
                      connect_handler,ready_handler,data_handler,close_handler,
                      (mg_authorization_handler)0x0,cbdata);
  return;
}

Assistant:

CIVETWEB_API void
mg_set_websocket_handler_with_subprotocols(
    struct mg_context *ctx,
    const char *uri,
    struct mg_websocket_subprotocols *subprotocols,
    mg_websocket_connect_handler connect_handler,
    mg_websocket_ready_handler ready_handler,
    mg_websocket_data_handler data_handler,
    mg_websocket_close_handler close_handler,
    void *cbdata)
{
	int is_delete_request = (connect_handler == NULL) && (ready_handler == NULL)
	                        && (data_handler == NULL)
	                        && (close_handler == NULL);
	mg_set_handler_type(ctx,
	                    &(ctx->dd),
	                    uri,
	                    WEBSOCKET_HANDLER,
	                    is_delete_request,
	                    NULL,
	                    subprotocols,
	                    connect_handler,
	                    ready_handler,
	                    data_handler,
	                    close_handler,
	                    NULL,
	                    cbdata);
}